

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> * __thiscall
Catch::TestRegistry::getAllTestsSorted(TestRegistry *this,IConfig *config)

{
  InWhatOrder IVar1;
  InWhatOrder IVar2;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_40;
  
  if ((this->m_sortedFunctions).
      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_sortedFunctions).
      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    enforceNoDuplicateTestCases(&this->m_functions);
  }
  IVar2 = this->m_currentSortOrder;
  IVar1 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x10])(config);
  if ((IVar2 != IVar1) ||
     ((this->m_sortedFunctions).
      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_sortedFunctions).
      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    sortTests(&local_40,config,&this->m_functions);
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::_M_move_assign
              (&this->m_sortedFunctions,&local_40);
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_40);
    IVar2 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x10])(config);
    this->m_currentSortOrder = IVar2;
  }
  return &this->m_sortedFunctions;
}

Assistant:

std::vector<TestCase> const &TestRegistry::getAllTestsSorted(IConfig const &config) const {
    if (m_sortedFunctions.empty())
      enforceNoDuplicateTestCases(m_functions);

    if (m_currentSortOrder != config.runOrder() || m_sortedFunctions.empty()) {
      m_sortedFunctions = sortTests(config, m_functions);
      m_currentSortOrder = config.runOrder();
    }
    return m_sortedFunctions;
  }